

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::dense::eye<std::complex<float>>(dense *this,int64_t size)

{
  complex<float> *pcVar1;
  complex<float> value;
  __uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
  extraout_RDX;
  __uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> _Var2;
  tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_> extraout_RDX_00;
  SquareMatrix<std::complex<float>_> SVar3;
  complex<float> local_38;
  long local_30;
  int64_t i;
  undefined1 local_19;
  int64_t local_18;
  int64_t size_local;
  SquareMatrix<std::complex<float>_> *mat;
  
  local_19 = 0;
  local_18 = size;
  size_local = (int64_t)this;
  std::complex<float>::complex((complex<float> *)((long)&i + 4),0.0,0.0);
  SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,size,value);
  _Var2._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
       (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
       extraout_RDX.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    std::complex<float>::complex(&local_38,1.0,0.0);
    pcVar1 = SquareMatrix<std::complex<float>_>::operator()
                       ((SquareMatrix<std::complex<float>_> *)this,local_30,local_30);
    pcVar1->_M_value = local_38._M_value;
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
         (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
         super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  }
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
         )_Var2._M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }